

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void Test_Template_TemplateRootDirectory::Run(void)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  undefined1 local_a8 [36];
  uint local_84;
  long local_80;
  string filename;
  pointer local_50;
  size_type sStack_48;
  
  std::__cxx11::string::string((string *)local_a8,"Test template",(allocator *)&local_50);
  ctemplate::StringToTemplateFile(&filename,(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  cVar1 = ctemplate::IsAbspath((string *)&filename);
  if (cVar1 == '\0') {
    printf("ASSERT FAILED, line %d: %s\n",0x54a,"IsAbspath(filename)");
    cVar1 = ctemplate::IsAbspath((string *)&filename);
    if (cVar1 == '\0') {
      __assert_fail("IsAbspath(filename)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x54a,"static void Test_Template_TemplateRootDirectory::Run()");
    }
LAB_001150d4:
    exit(1);
  }
  local_a8._0_8_ = filename._M_dataplus._M_p;
  local_a8._8_8_ = filename._M_string_length;
  local_a8[0x10] = '\0';
  local_a8._24_8_ = 0;
  lVar3 = ctemplate::Template::GetTemplate((TemplateString *)local_a8,DO_NOT_STRIP);
  std::__cxx11::string::string
            ((string *)local_a8,(char *)&ctemplate::kRootdir,(allocator *)&local_50);
  ctemplate::Template::SetTemplateRootDirectory((string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  local_a8._0_8_ = filename._M_dataplus._M_p;
  local_a8._8_8_ = filename._M_string_length;
  local_a8[0x10] = '\0';
  local_a8._24_8_ = 0;
  lVar4 = ctemplate::Template::GetTemplate((TemplateString *)local_a8,DO_NOT_STRIP);
  std::__cxx11::string::string((string *)local_a8,"/sadfadsf/waerfsa/safdg",(allocator *)&local_50);
  ctemplate::Template::SetTemplateRootDirectory((string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  local_a8._0_8_ = filename._M_dataplus._M_p;
  local_a8._8_8_ = filename._M_string_length;
  local_a8[0x10] = '\0';
  local_a8._24_8_ = 0;
  lVar5 = ctemplate::Template::GetTemplate((TemplateString *)local_a8,DO_NOT_STRIP);
  if (lVar3 == 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x551,"tpl1 != NULL");
    __assert_fail("tpl1 != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x551,"static void Test_Template_TemplateRootDirectory::Run()");
  }
  if (lVar3 != lVar4) {
    printf("ASSERT FAILED, line %d: %s\n",0x552,"tpl1 == tpl2");
    __assert_fail("tpl1 == tpl2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x552,"static void Test_Template_TemplateRootDirectory::Run()");
  }
  local_80 = lVar3;
  if (lVar3 != lVar5) {
    printf("ASSERT FAILED, line %d: %s\n",0x553,"tpl1 == tpl3");
    __assert_fail("tpl1 == tpl3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x553,"static void Test_Template_TemplateRootDirectory::Run()");
  }
  lVar3 = 0;
  do {
    if (lVar3 == 2) {
      std::__cxx11::string::~string((string *)&filename);
      return;
    }
    local_84 = (uint)"/\\"[lVar3];
    while( true ) {
      lVar4 = std::__cxx11::string::find((char)&filename,(ulong)local_84);
      if (lVar4 == -1) break;
      std::__cxx11::string::substr((ulong)local_a8,(ulong)&filename);
      ctemplate::Template::SetTemplateRootDirectory((string *)local_a8);
      std::__cxx11::string::~string((string *)local_a8);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&filename);
      local_a8._0_8_ = local_50;
      local_a8._8_8_ = sStack_48;
      local_a8[0x10] = '\0';
      local_a8._24_8_ = 0;
      ctemplate::Template::GetTemplate((TemplateString *)local_a8,DO_NOT_STRIP);
      std::__cxx11::string::~string((string *)&local_50);
      pcVar6 = (char *)ctemplate::Template::template_file();
      std::__cxx11::string::string((string *)local_a8,pcVar6,(allocator *)&local_50);
      pcVar6 = (char *)ctemplate::Template::template_file();
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a8,pcVar6);
      std::__cxx11::string::~string((string *)local_a8);
      if (!bVar2) {
        printf("ASSERT FAILED, line %d: %s\n",0x561,
               "string(tpl->template_file()) == tpl1->template_file()");
        pcVar6 = (char *)ctemplate::Template::template_file();
        std::__cxx11::string::string((string *)local_a8,pcVar6,(allocator *)&local_50);
        pcVar6 = (char *)ctemplate::Template::template_file();
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_a8,pcVar6);
        if (!bVar2) {
          __assert_fail("string(tpl->template_file()) == tpl1->template_file()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                        ,0x561,"static void Test_Template_TemplateRootDirectory::Run()");
        }
        std::__cxx11::string::~string((string *)local_a8);
        goto LAB_001150d4;
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

TEST(Template, TemplateRootDirectory) {
  string filename = StringToTemplateFile("Test template");
  ASSERT(IsAbspath(filename));
  Template* tpl1 = Template::GetTemplate(filename, DO_NOT_STRIP);
  Template::SetTemplateRootDirectory(kRootdir);  // "/"
  // template-root shouldn't matter for absolute directories
  Template* tpl2 = Template::GetTemplate(filename, DO_NOT_STRIP);
  Template::SetTemplateRootDirectory("/sadfadsf/waerfsa/safdg");
  Template* tpl3 = Template::GetTemplate(filename, DO_NOT_STRIP);
  ASSERT(tpl1 != NULL);
  ASSERT(tpl1 == tpl2);
  ASSERT(tpl1 == tpl3);

  // Now test it actually works by breaking the abspath in various places.
  // We do it twice, since we don't know if the path-sep is "/" or "\".
  // NOTE: this depends on filename not using "/" or "\" except as a
  //       directory separator (so nothing like "/var/tmp/foo\a/weirdfile").
  const char* const kPathSeps = "/\\";
  for (const char* path_sep = kPathSeps; *path_sep; path_sep++) {
    for (string::size_type sep_pos = filename.find(*path_sep, 0);
         sep_pos != string::npos;
         sep_pos = filename.find(*path_sep, sep_pos + 1)) {
      Template::SetTemplateRootDirectory(filename.substr(0, sep_pos + 1));
      Template* tpl = Template::GetTemplate(filename.substr(sep_pos + 1),
                                            DO_NOT_STRIP);
      ASSERT(string(tpl->template_file()) == tpl1->template_file());
    }
  }
}